

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numrange.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  char *range;
  size_t sVar2;
  vector<int,_std::allocator<int>_> *__range2;
  int *piVar3;
  vector<int,_std::allocator<int>_> result;
  vector<int,_std::allocator<int>_> local_48;
  
  range = argv[1];
  if (range == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"null",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  else {
    QUtil::parse_numrange(&local_48,range,0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"numeric range ",0xe);
    sVar2 = strlen(range);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,range,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ->",3);
    for (piVar3 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar3 != local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
      iVar1 = *piVar3;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::operator<<((ostream *)&std::cout,iVar1);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    try {
        test_numrange(argv[1]);
    } catch (std::exception& e) {
        std::cout << e.what() << std::endl;
        return 2;
    }

    return 0;
}